

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QThemeIconInfo * __thiscall
QIconLoader::findIconHelper
          (QThemeIconInfo *__return_storage_ptr__,QIconLoader *this,QString *themeName,
          QString *iconName,QStringList *visited,DashRule rule)

{
  QArrayDataPointer<char16_t> *this_00;
  Data *pDVar1;
  Data *pDVar2;
  QSharedPointer<QIconCacheGtkReader> *pQVar3;
  QIconCacheGtkReader *this_01;
  Data *dd;
  QString *pQVar4;
  QStringView name;
  bool bVar5;
  char cVar6;
  QDebug *pQVar7;
  QIconTheme *this_02;
  char **ppcVar8;
  pointer puVar9;
  qsizetype qVar10;
  pointer puVar11;
  ulong uVar12;
  QIconDirInfo *s1;
  undefined1 *puVar13;
  char **ppcVar14;
  long lVar15;
  QIconDirInfo *args;
  QIconDirInfo *pQVar16;
  int j;
  long lVar17;
  char *pcVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  __uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_> local_1c0;
  __single_object iconEntry_1;
  char *s;
  QArrayDataPointer<QString> *pQStack_1a0;
  undefined1 *local_198;
  QByteArrayView local_188;
  QArrayDataPointer<const_char_*> local_178;
  QArrayDataPointer<QIconDirInfo> local_158;
  QArrayDataPointer<QString> local_138;
  undefined1 local_120 [24];
  QString *local_108;
  ulong local_100;
  QIconTheme local_f8;
  undefined1 local_88 [24];
  QIconDirInfo *pQStack_70;
  undefined1 *local_68;
  QArrayDataPointer<QIconDirInfo> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_f8.m_contentDirs.d.d._0_4_ = 2;
    local_f8.m_contentDirs.d.d._4_4_ = 0;
    local_f8.m_contentDirs.d.ptr._0_4_ = 0;
    local_f8.m_contentDirs.d.ptr._4_4_ = 0;
    local_f8.m_contentDirs.d.size._0_4_ = 0;
    local_f8.m_contentDirs.d.size._4_4_ = 0;
    local_f8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
    QMessageLogger::debug();
    pQVar7 = QDebug::operator<<((QDebug *)(local_120 + 0x10),"Finding icon");
    pQVar7 = QDebug::operator<<(pQVar7,iconName);
    pQVar7 = QDebug::operator<<(pQVar7,"in theme");
    pQVar7 = QDebug::operator<<(pQVar7,themeName);
    pQVar7 = QDebug::operator<<(pQVar7,"skipping");
    local_88._0_8_ = pQVar7->stream;
    ((Stream *)local_88._0_8_)->ref = ((Stream *)local_88._0_8_)->ref + 1;
    ::operator<<((Stream *)(local_88 + 8),(QList<QString> *)local_88);
    QDebug::~QDebug((QDebug *)(local_88 + 8));
    QDebug::~QDebug((QDebug *)local_88);
    QDebug::~QDebug((QDebug *)(local_120 + 0x10));
  }
  (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->iconName).d.size = 0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  QList<QString>::emplaceBack<QString_const&>(visited,themeName);
  this_02 = QFlatMap<QString,_QIconTheme,_std::less<QString>,_QVarLengthArray<QString,_5LL>,_QVarLengthArray<QIconTheme,_5LL>_>
            ::operator[](&this->themeList,themeName);
  if (this_02->m_valid == false) {
    QIconTheme::QIconTheme(&local_f8,themeName);
    QIconTheme::operator=(this_02,&local_f8);
    QIconTheme::~QIconTheme(&local_f8);
    if (this_02->m_valid == false) {
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_f8.m_contentDirs.d.d._0_4_ = 2;
        local_f8.m_contentDirs.d.d._4_4_ = 0;
        local_f8.m_contentDirs.d.ptr._0_4_ = 0;
        local_f8.m_contentDirs.d.ptr._4_4_ = 0;
        local_f8.m_contentDirs.d.size._0_4_ = 0;
        local_f8.m_contentDirs.d.size._4_4_ = 0;
        local_f8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
        QMessageLogger::debug();
        pQVar7 = QDebug::operator<<((QDebug *)(local_120 + 0x10),"Theme");
        pQVar7 = QDebug::operator<<(pQVar7,themeName);
        QDebug::operator<<(pQVar7,"not found");
        QDebug::~QDebug((QDebug *)(local_120 + 0x10));
      }
      goto LAB_00261e10;
    }
  }
  local_120._16_8_ = (this_02->m_contentDirs).d.d;
  local_108 = (this_02->m_contentDirs).d.ptr;
  local_100 = (this_02->m_contentDirs).d.size;
  if ((Data *)local_120._16_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_120._16_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_120._16_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + 1;
    UNLOCK();
  }
  local_120._8_8_ = (iconName->d).ptr;
  pDVar1 = (Data *)(iconName->d).size;
  puVar9 = (__return_storage_ptr__->entries).
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (__return_storage_ptr__->entries).
            super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_120._0_8_ = pDVar1;
  if (puVar9 == puVar11) {
    pDVar2 = (Data *)(this->m_iconName).d.size;
    local_f8.m_contentDirs.d.size._0_4_ = 0xaaaaaaaa;
    local_f8.m_contentDirs.d.size._4_4_ = 0xaaaaaaaa;
    local_f8.m_contentDirs.d.d._0_4_ = 0xaaaaaaaa;
    local_f8.m_contentDirs.d.d._4_4_ = 0xaaaaaaaa;
    local_f8.m_contentDirs.d.ptr._0_4_ = 0xaaaaaaaa;
    local_f8.m_contentDirs.d.ptr._4_4_ = 0xaaaaaaaa;
    local_138.ptr = (QString *)0x4;
    local_138.size = 0x5c4a5e;
    local_138.d = (Data *)local_120;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_f8,(QStringBuilder<QStringView_&,_QLatin1String> *)&local_138);
    local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_138.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_158.ptr = (QIconDirInfo *)0x4;
    local_158.size = 0x5fea5e;
    local_158.d = (Data *)local_120;
    QStringBuilder<QStringView_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_138,(QStringBuilder<QStringView_&,_QLatin1String> *)&local_158);
    this_00 = (QArrayDataPointer<char16_t> *)(local_88 + 0x10);
    for (uVar12 = 0; uVar12 < local_100; uVar12 = uVar12 + 1) {
      local_158.d = (this_02->m_keyList).d.d;
      local_158.ptr = (this_02->m_keyList).d.ptr;
      local_158.size = (this_02->m_keyList).d.size;
      if ((QString *)local_158.d != (QString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_158.d)->d).d = *(int *)&(((QString *)local_158.d)->d).d + 1;
        UNLOCK();
      }
      pQVar3 = (this_02->m_gtkCaches).d.ptr;
      this_01 = pQVar3[uVar12].value.ptr;
      dd = pQVar3[uVar12].d;
      if (dd != (Data *)0x0) {
        LOCK();
        (dd->weakref)._q_value.super___atomic_base<int>._M_i =
             (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (dd->strongref)._q_value.super___atomic_base<int>._M_i =
             (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (this_01->m_isValid == true) {
        local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_178.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
        name.m_data = (storage_type_conflict *)local_120._8_8_;
        name.m_size = local_120._0_8_;
        QIconCacheGtkReader::lookup((QList<const_char_*> *)&local_178,this_01,name);
        if (this_01->m_isValid == true) {
          local_58.d = local_158.d;
          local_58.ptr = local_158.ptr;
          local_58.size = local_158.size;
          if ((QString *)local_158.d != (QString *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(local_158.d)->super_QArrayData)->d =
                 *(int *)&((DataPointer *)&(local_158.d)->super_QArrayData)->d + 1;
            UNLOCK();
          }
          QList<QIconDirInfo>::clear((QList<QIconDirInfo> *)&local_158);
          QList<QIconDirInfo>::reserve((QList<QIconDirInfo> *)&local_158,local_178.size);
          ppcVar8 = local_178.ptr + local_178.size;
          for (ppcVar14 = local_178.ptr; ppcVar14 != ppcVar8; ppcVar14 = ppcVar14 + 1) {
            s = *ppcVar14;
            local_68 = &DAT_aaaaaaaaaaaaaaaa;
            local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pQStack_70 = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
            QByteArrayView::QByteArrayView<const_char_*,_true>(&local_188,&s);
            QVar19.m_data = (storage_type *)local_188.m_size;
            QVar19.m_size = (qsizetype)this_00;
            QString::fromUtf8(QVar19);
            lVar17 = local_58.size * 0x28;
            pQVar16 = local_58.ptr + local_58.size;
            s1 = local_58.ptr;
            for (lVar15 = local_58.size >> 2; 0 < lVar15; lVar15 = lVar15 + -1) {
              bVar5 = ::comparesEqual(&s1->path,(QString *)this_00);
              args = s1;
              if (bVar5) goto LAB_002616f1;
              bVar5 = ::comparesEqual(&s1[1].path,(QString *)this_00);
              args = s1 + 1;
              if (bVar5) goto LAB_002616f1;
              bVar5 = ::comparesEqual(&s1[2].path,(QString *)this_00);
              args = s1 + 2;
              if (bVar5) goto LAB_002616f1;
              bVar5 = ::comparesEqual(&s1[3].path,(QString *)this_00);
              args = s1 + 3;
              if (bVar5) goto LAB_002616f1;
              s1 = s1 + 4;
              lVar17 = lVar17 + -0xa0;
            }
            lVar17 = lVar17 / 0x28;
            if (lVar17 == 1) {
LAB_0026173f:
              bVar5 = ::comparesEqual(&s1->path,(QString *)this_00);
              args = pQVar16;
              if (bVar5) {
                args = s1;
              }
            }
            else if (lVar17 == 2) {
LAB_002616d0:
              bVar5 = ::comparesEqual(&s1->path,(QString *)this_00);
              args = s1;
              if (!bVar5) {
                s1 = s1 + 1;
                goto LAB_0026173f;
              }
            }
            else {
              args = pQVar16;
              if ((lVar17 == 3) &&
                 (bVar5 = ::comparesEqual(&s1->path,(QString *)this_00), args = s1, !bVar5)) {
                s1 = s1 + 1;
                goto LAB_002616d0;
              }
            }
LAB_002616f1:
            if (args != local_58.ptr + local_58.size) {
              QList<QIconDirInfo>::emplaceBack<QIconDirInfo_const&>
                        ((QList<QIconDirInfo> *)&local_158,args);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
          }
          QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_58);
        }
        QArrayDataPointer<const_char_*>::~QArrayDataPointer(&local_178);
      }
      local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_178.ptr = (char **)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)(local_108 + uVar12);
      local_58.ptr = (QIconDirInfo *)CONCAT62(local_58.ptr._2_6_,0x2f);
      QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                ((QString *)&local_178,(QStringBuilder<const_QString_&,_char16_t> *)&local_58);
      lVar17 = 0;
      for (pcVar18 = (char *)0x0; pcVar18 < (ulong)local_158.size; pcVar18 = pcVar18 + 1) {
        if ((pDVar2 <= pDVar1) || (1 < (byte)((&(local_158.ptr)->context)[lVar17] - Applications)))
        {
          pQVar16 = (QIconDirInfo *)((long)&((local_158.ptr)->path).d.d + lVar17);
          local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
          local_88._16_8_ = &local_178;
          local_68 = (undefined1 *)CONCAT62(local_68._2_6_,0x2f);
          pQStack_70 = pQVar16;
          QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t>::convertTo<QString>
                    ((QString *)&local_58,
                     (QStringBuilder<QStringBuilder<QString_&,_const_QString_&>,_char16_t> *)this_00
                    );
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_70 = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
          pQStack_1a0 = &local_138;
          s = (char *)&local_58;
          QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                    ((QString *)this_00,(QStringBuilder<const_QString_&,_const_QString_&> *)&s);
          cVar6 = QFile::exists((QString *)this_00);
          if (cVar6 == '\0') {
            if (this->m_supportsSvg == true) {
              local_198 = &DAT_aaaaaaaaaaaaaaaa;
              s = &DAT_aaaaaaaaaaaaaaaa;
              pQStack_1a0 = (QArrayDataPointer<QString> *)&DAT_aaaaaaaaaaaaaaaa;
              iconEntry_1._M_t.
              super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>._M_t.
              super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
              super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ScalableEntry,_std::default_delete<ScalableEntry>,_true,_true>)
                   &local_58;
              QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                        ((QString *)&s,
                         (QStringBuilder<const_QString_&,_const_QString_&> *)&iconEntry_1);
              cVar6 = QFile::exists((QString *)&s);
              if (cVar6 != '\0') {
                iconEntry_1._M_t.
                super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>._M_t.
                super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
                super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl =
                     (__uniq_ptr_data<ScalableEntry,_std::default_delete<ScalableEntry>,_true,_true>
                     )&DAT_aaaaaaaaaaaaaaaa;
                std::make_unique<ScalableEntry>();
                QIconDirInfo::operator=
                          ((QIconDirInfo *)
                           ((long)iconEntry_1._M_t.
                                  super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>
                                  .super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl + 0x20
                           ),pQVar16);
                QString::operator=((QString *)
                                   ((long)iconEntry_1._M_t.
                                          super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>
                                          .super__Head_base<0UL,_ScalableEntry_*,_false>.
                                          _M_head_impl + 8),(QString *)&s);
                local_1c0._M_t.
                super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
                super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl =
                     (tuple<ScalableEntry_*,_std::default_delete<ScalableEntry>_>)
                     (tuple<ScalableEntry_*,_std::default_delete<ScalableEntry>_>)iconEntry_1;
                iconEntry_1._M_t.
                super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>._M_t.
                super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
                super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl =
                     (__uniq_ptr_data<ScalableEntry,_std::default_delete<ScalableEntry>,_true,_true>
                     )(__uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>)0x0;
                std::
                vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                ::
                emplace_back<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>
                          ((vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>
                            *)__return_storage_ptr__,
                           (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                            *)&local_1c0);
                if ((_Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>)
                    local_1c0._M_t.
                    super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
                    super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl !=
                    (ScalableEntry *)0x0) {
                  (**(code **)(*(long *)local_1c0._M_t.
                                        super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>
                                        .super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl
                              + 8))();
                }
                std::unique_ptr<ScalableEntry,_std::default_delete<ScalableEntry>_>::~unique_ptr
                          (&iconEntry_1);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&s);
            }
          }
          else {
            s = &DAT_aaaaaaaaaaaaaaaa;
            std::make_unique<PixmapEntry>();
            QIconDirInfo::operator=((QIconDirInfo *)(s + 0x20),pQVar16);
            QString::operator=((QString *)(s + 8),(QString *)this_00);
            iconEntry_1._M_t.
            super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>._M_t.
            super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
            super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ScalableEntry,_std::default_delete<ScalableEntry>,_true,_true>)
                 (__uniq_ptr_data<ScalableEntry,_std::default_delete<ScalableEntry>,_true,_true>)s;
            s = (char *)0x0;
            std::
            vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ::_M_insert_rval(&__return_storage_ptr__->entries,
                             (__return_storage_ptr__->entries).
                             super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(value_type *)&iconEntry_1);
            if ((__uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>)
                iconEntry_1._M_t.
                super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>._M_t.
                super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>.
                super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>)0x0) {
              (**(code **)(*(long *)iconEntry_1._M_t.
                                    super___uniq_ptr_impl<ScalableEntry,_std::default_delete<ScalableEntry>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ScalableEntry_*,_std::default_delete<ScalableEntry>_>
                                    .super__Head_base<0UL,_ScalableEntry_*,_false>._M_head_impl + 8)
              )();
            }
            std::unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_>::~unique_ptr
                      ((unique_ptr<PixmapEntry,_std::default_delete<PixmapEntry>_> *)&s);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        }
        lVar17 = lVar17 + 0x28;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
      QSharedPointer<QIconCacheGtkReader>::deref(dd);
      QArrayDataPointer<QIconDirInfo>::~QArrayDataPointer(&local_158);
    }
    if ((__return_storage_ptr__->entries).
        super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (__return_storage_ptr__->entries).
        super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      QStringView::toString((QString *)&local_158,(QStringView *)local_120);
      pQVar4 = (QString *)(__return_storage_ptr__->iconName).d.d;
      pQVar16 = (QIconDirInfo *)(__return_storage_ptr__->iconName).d.ptr;
      (__return_storage_ptr__->iconName).d.d = (Data *)local_158.d;
      (__return_storage_ptr__->iconName).d.ptr = (char16_t *)local_158.ptr;
      pcVar18 = (char *)(__return_storage_ptr__->iconName).d.size;
      (__return_storage_ptr__->iconName).d.size = local_158.size;
      local_158.d = (Data *)pQVar4;
      local_158.ptr = pQVar16;
      local_158.size = (qsizetype)pcVar18;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
    puVar9 = (__return_storage_ptr__->entries).
             super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar11 = (__return_storage_ptr__->entries).
              super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar9 == puVar11) {
    local_138.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_138.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_138.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QIconTheme::parents((QStringList *)&local_138,this_02);
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_f8.m_contentDirs.d.d._0_4_ = 2;
      local_f8.m_contentDirs.d.d._4_4_ = 0;
      local_f8.m_contentDirs.d.ptr._0_4_ = 0;
      local_f8.m_contentDirs.d.ptr._4_4_ = 0;
      local_f8.m_contentDirs.d.size._0_4_ = 0;
      local_f8.m_contentDirs.d.size._4_4_ = 0;
      local_f8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
      QMessageLogger::debug();
      pQVar7 = QDebug::operator<<((QDebug *)&local_178,"Did not find matching icons in theme;");
      pQVar7 = QDebug::operator<<(pQVar7,"trying parent themes");
      local_1d8._0_8_ = pQVar7->stream;
      ((Stream *)local_1d8._0_8_)->ref = ((Stream *)local_1d8._0_8_)->ref + 1;
      ::operator<<((Stream *)&local_158,(QList<QString> *)local_1d8);
      pQVar7 = QDebug::operator<<((QDebug *)&local_158,"skipping visited");
      local_1d8._8_8_ = pQVar7->stream;
      ((Stream *)local_1d8._8_8_)->ref = ((Stream *)local_1d8._8_8_)->ref + 1;
      ::operator<<((Stream *)local_1c8,(QList<QString> *)(local_1d8 + 8));
      QDebug::~QDebug((QDebug *)local_1c8);
      QDebug::~QDebug((QDebug *)(local_1d8 + 8));
      QDebug::~QDebug((QDebug *)&local_158);
      QDebug::~QDebug((QDebug *)local_1d8);
      QDebug::~QDebug((QDebug *)&local_178);
    }
    puVar13 = (undefined1 *)0xffffffffffffffff;
    do {
      puVar13 = puVar13 + 1;
      if ((ulong)local_138.size <= puVar13) break;
      local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.ptr = (QIconDirInfo *)&DAT_aaaaaaaaaaaaaaaa;
      QString::trimmed_helper((QString *)&local_158);
      bVar5 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)visited,(QString *)&local_158,CaseSensitive
                        );
      if (!bVar5) {
        findIconHelper((QThemeIconInfo *)&local_f8,this,(QString *)&local_158,iconName,visited,
                       NoFallBack);
        QThemeIconInfo::operator=(__return_storage_ptr__,(QThemeIconInfo *)&local_f8);
        QThemeIconInfo::~QThemeIconInfo((QThemeIconInfo *)&local_f8);
      }
      puVar9 = (__return_storage_ptr__->entries).
               super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar11 = (__return_storage_ptr__->entries).
                super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
    } while (puVar9 == puVar11);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
  }
  if ((rule == FallBack) &&
     ((__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (__return_storage_ptr__->entries).
      super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    qVar10 = QStringView::lastIndexOf((QStringView *)local_120,(QChar)0x2d,CaseSensitive);
    if ((int)qVar10 != -1) {
      lcIconLoader();
      if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_f8.m_contentDirs.d.d._0_4_ = 2;
        local_f8.m_contentDirs.d.d._4_4_ = 0;
        local_f8.m_contentDirs.d.ptr._0_4_ = 0;
        local_f8.m_contentDirs.d.ptr._4_4_ = 0;
        local_f8.m_contentDirs.d.size._0_4_ = 0;
        local_f8.m_contentDirs.d.size._4_4_ = 0;
        local_f8.m_keyList.d.d = (Data *)lcIconLoader::category.name;
        QMessageLogger::debug();
        pQVar7 = QDebug::operator<<((QDebug *)&local_138,
                                    "Did not find matching icons in all themes;");
        QDebug::operator<<(pQVar7,"trying dash fallback");
        QDebug::~QDebug((QDebug *)&local_138);
      }
      local_120._0_8_ = SEXT48((int)qVar10);
      local_138.d = (Data *)0x0;
      local_138.ptr = (QString *)0x0;
      local_138.size = 0;
      QStringView::toString((QString *)&local_158,(QStringView *)local_120);
      findIconHelper((QThemeIconInfo *)&local_f8,this,themeName,(QString *)&local_158,
                     (QStringList *)&local_138,FallBack);
      QThemeIconInfo::operator=(__return_storage_ptr__,(QThemeIconInfo *)&local_f8);
      QThemeIconInfo::~QThemeIconInfo((QThemeIconInfo *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_158);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_120 + 0x10));
LAB_00261e10:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QThemeIconInfo QIconLoader::findIconHelper(const QString &themeName,
                                           const QString &iconName,
                                           QStringList &visited,
                                           DashRule rule) const
{
    qCDebug(lcIconLoader) << "Finding icon" << iconName << "in theme" << themeName
                          << "skipping" << visited;

    QThemeIconInfo info;
    Q_ASSERT(!themeName.isEmpty());

    // Used to protect against potential recursions
    visited << themeName;

    QIconTheme &theme = themeList[themeName];
    if (!theme.isValid()) {
        theme = QIconTheme(themeName);
        if (!theme.isValid()) {
            qCDebug(lcIconLoader) << "Theme" << themeName << "not found";
            return info;
        }
    }

    const QStringList contentDirs = theme.contentDirs();

    QStringView iconNameFallback(iconName);
    bool searchingGenericFallback = m_iconName.length() > iconName.length();

    // Iterate through all icon's fallbacks in current theme
    if (info.entries.empty()) {
        const QString svgIconName = iconNameFallback + ".svg"_L1;
        const QString pngIconName = iconNameFallback + ".png"_L1;

        // Add all relevant files
        for (int i = 0; i < contentDirs.size(); ++i) {
            QList<QIconDirInfo> subDirs = theme.keyList();

            // Try to reduce the amount of subDirs by looking in the GTK+ cache in order to save
            // a massive amount of file stat (especially if the icon is not there)
            auto cache = theme.m_gtkCaches.at(i);
            if (cache->isValid()) {
                const auto result = cache->lookup(iconNameFallback);
                if (cache->isValid()) {
                    const QList<QIconDirInfo> subDirsCopy = subDirs;
                    subDirs.clear();
                    subDirs.reserve(result.size());
                    for (const char *s : result) {
                        QString path = QString::fromUtf8(s);
                        auto it = std::find_if(subDirsCopy.cbegin(), subDirsCopy.cend(),
                                               [&](const QIconDirInfo &info) {
                                                   return info.path == path; } );
                        if (it != subDirsCopy.cend()) {
                            subDirs.append(*it);
                        }
                    }
                }
            }

            QString contentDir = contentDirs.at(i) + u'/';
            for (int j = 0; j < subDirs.size() ; ++j) {
                const QIconDirInfo &dirInfo = subDirs.at(j);
                if (searchingGenericFallback &&
                        (dirInfo.context == QIconDirInfo::Applications ||
                         dirInfo.context == QIconDirInfo::MimeTypes))
                    continue;

                const QString subDir = contentDir + dirInfo.path + u'/';
                const QString pngPath = subDir + pngIconName;
                if (QFile::exists(pngPath)) {
                    auto iconEntry = std::make_unique<PixmapEntry>();
                    iconEntry->dir = dirInfo;
                    iconEntry->filename = pngPath;
                    // Notice we ensure that pixmap entries always come before
                    // scalable to preserve search order afterwards
                    info.entries.insert(info.entries.begin(), std::move(iconEntry));
                } else if (m_supportsSvg) {
                    const QString svgPath = subDir + svgIconName;
                    if (QFile::exists(svgPath)) {
                        auto iconEntry = std::make_unique<ScalableEntry>();
                        iconEntry->dir = dirInfo;
                        iconEntry->filename = svgPath;
                        info.entries.push_back(std::move(iconEntry));
                    }
                }
            }
        }

        if (!info.entries.empty()) {
            info.iconName = iconNameFallback.toString();
        }
    }

    if (info.entries.empty()) {
        const QStringList parents = theme.parents();
        qCDebug(lcIconLoader) << "Did not find matching icons in theme;"
            << "trying parent themes" << parents
            << "skipping visited" << visited;

        // Search recursively through inherited themes
        for (int i = 0 ; i < parents.size() ; ++i) {

            const QString parentTheme = parents.at(i).trimmed();

            if (!visited.contains(parentTheme)) // guard against recursion
                info = findIconHelper(parentTheme, iconName, visited, QIconLoader::NoFallBack);

            if (!info.entries.empty()) // success
                break;
        }
    }

    if (rule == QIconLoader::FallBack && info.entries.empty()) {
        // If it's possible - find next fallback for the icon
        const int indexOfDash = iconNameFallback.lastIndexOf(u'-');
        if (indexOfDash != -1) {
            qCDebug(lcIconLoader) << "Did not find matching icons in all themes;"
                                  << "trying dash fallback";
            iconNameFallback.truncate(indexOfDash);
            QStringList _visited;
            info = findIconHelper(themeName, iconNameFallback.toString(), _visited, QIconLoader::FallBack);
        }
    }

    return info;
}